

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *args_3;
  SyntaxList<slang::syntax::MemberSyntax> *args_6;
  CoverCrossSyntax *pCVar1;
  CoverageIffClauseSyntax *local_80;
  DeepCloneVisitor visitor;
  NamedLabelSyntax *local_68;
  DeepCloneVisitor visitor_1;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x50) == (SyntaxNode *)0x0) {
    local_68 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_68 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x50),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::IdentifierNameSyntax>
                     ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)(__fn + 0x68),
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xa0) == (SyntaxNode *)0x0) {
    local_80 = (CoverageIffClauseSyntax *)0x0;
  }
  else {
    local_80 = (CoverageIffClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0xa0),&visitor_1,(BumpAllocator *)__child_stack);
  }
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0xa8),(BumpAllocator *)__child_stack);
  args_6 = deepClone<slang::syntax::MemberSyntax>
                     ((SyntaxList<slang::syntax::MemberSyntax> *)(__fn + 0xb8),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0xf0),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x100),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CoverCrossSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::NamedLabelSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_68,(Token *)&visitor,args_3,
                      &local_80,(Token *)&visitor_1,args_6,&local_40,&local_50);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CoverCrossSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CoverCrossSyntax>(
        *deepClone(node.attributes, alloc),
        node.label ? deepClone(*node.label, alloc) : nullptr,
        node.cross.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.iff ? deepClone(*node.iff, alloc) : nullptr,
        node.openBrace.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.closeBrace.deepClone(alloc),
        node.emptySemi.deepClone(alloc)
    );
}